

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

double __thiscall
ON_SubDVertex::Internal_InteriorCreaseVertexSharpnessForExperts(ON_SubDVertex *this)

{
  if (this->m_vertex_tag != Crease) {
    return 0.0;
  }
  return (double)this->m_interior_crease_vertex_sharpness;
}

Assistant:

double ON_SubDVertex::Internal_InteriorCreaseVertexSharpnessForExperts() const
{
  // This function cannot check that this->IsInteriorCrease() is true because
  // this function is used on partial subsets of a SubD in low level evaluation code.
  // When a vertex is an interior crease in the complete SubD, these partial
  // SubD include only one of the sectors. Thus, all that can be checked is the
  // crease tag settings
  return (ON_SubDVertexTag::Crease == m_vertex_tag) ? m_interior_crease_vertex_sharpness : 0.0;
}